

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getStrictSubTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this,HeapType type)

{
  pointer pHVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar2;
  pointer pHVar3;
  value_type local_60;
  HeapType type_local;
  HeapType sub;
  undefined1 auStack_48 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> work;
  
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.id = type.id;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,&local_60);
  while (auStack_48 !=
         (undefined1  [8])
         work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start) {
    pHVar3 = work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start + -1;
    work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start =
         work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
    pvVar2 = getImmediateSubTypes(this,(HeapType)pHVar3->id);
    pHVar1 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pHVar3 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_start; pHVar3 != pHVar1; pHVar3 = pHVar3 + 1) {
      type_local.id = pHVar3->id;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (__return_storage_ptr__,&type_local);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,&type_local);
    }
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getStrictSubTypes(HeapType type) {
    std::vector<HeapType> ret, work;
    work.push_back(type);
    while (!work.empty()) {
      auto curr = work.back();
      work.pop_back();
      for (auto sub : getImmediateSubTypes(curr)) {
        ret.push_back(sub);
        work.push_back(sub);
      }
    }
    return ret;
  }